

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O2

void __thiscall
Wasm::WasmSignature::AllocateResults(WasmSignature *this,uint32 count,Recycler *recycler)

{
  Recycler *this_00;
  WasmType *ptr;
  WasmCompilationException *this_01;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->m_resultsCount == 0) {
    if (count != 0) {
      local_48 = (undefined1  [8])&WasmTypes::WasmType::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_afd287d;
      data.filename._0_4_ = 0x35;
      data.plusSize = (ulong)count;
      this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
      ptr = Memory::AllocateArray<Memory::Recycler,Wasm::WasmTypes::WasmType,false>
                      ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)count)
      ;
      Memory::WriteBarrierPtr<Wasm::WasmTypes::WasmType>::WriteBarrierSet(&this->m_results,ptr);
    }
    this->m_resultsCount = count;
    return;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,
             L"Invalid call to WasmSignature::AllocateResults: Results are already allocated");
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmSignature::AllocateResults(uint32 count, Recycler * recycler)
{
    if (GetResultCount() != 0)
    {
        throw WasmCompilationException(_u("Invalid call to WasmSignature::AllocateResults: Results are already allocated"));
    }
    if (count > 0)
    {
        m_results = RecyclerNewArrayLeafZ(recycler, WasmTypes::WasmType, count);
    }
    m_resultsCount = count;
}